

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_trcddi.cpp
# Opt level: O0

ze_result_t
zeGetRTASParallelOperationProcAddrTable
          (ze_api_version_t version,ze_rtas_parallel_operation_dditable_t *pDdiTable)

{
  ze_result_t result;
  ze_rtas_parallel_operation_dditable_t *dditable;
  ze_rtas_parallel_operation_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  if (pDdiTable == (ze_rtas_parallel_operation_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (((int)tracing_layer::context >> 0x10 == (int)version >> 0x10) &&
          ((tracing_layer::context & 0xffff) <= (version & 0xffff))) {
    DAT_002da288 = pDdiTable->pfnCreateExt;
    pDdiTable->pfnCreateExt = tracing_layer::zeRTASParallelOperationCreateExt;
    DAT_002da290 = pDdiTable->pfnGetPropertiesExt;
    pDdiTable->pfnGetPropertiesExt = tracing_layer::zeRTASParallelOperationGetPropertiesExt;
    DAT_002da298 = pDdiTable->pfnJoinExt;
    pDdiTable->pfnJoinExt = tracing_layer::zeRTASParallelOperationJoinExt;
    DAT_002da2a0 = pDdiTable->pfnDestroyExt;
    pDdiTable->pfnDestroyExt = tracing_layer::zeRTASParallelOperationDestroyExt;
    pDdiTable_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  else {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetRTASParallelOperationProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_rtas_parallel_operation_dditable_t* pDdiTable///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = tracing_layer::context.zeDdiTable.RTASParallelOperation;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(tracing_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(tracing_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnCreateExt                                = pDdiTable->pfnCreateExt;
    pDdiTable->pfnCreateExt                              = tracing_layer::zeRTASParallelOperationCreateExt;

    dditable.pfnGetPropertiesExt                         = pDdiTable->pfnGetPropertiesExt;
    pDdiTable->pfnGetPropertiesExt                       = tracing_layer::zeRTASParallelOperationGetPropertiesExt;

    dditable.pfnJoinExt                                  = pDdiTable->pfnJoinExt;
    pDdiTable->pfnJoinExt                                = tracing_layer::zeRTASParallelOperationJoinExt;

    dditable.pfnDestroyExt                               = pDdiTable->pfnDestroyExt;
    pDdiTable->pfnDestroyExt                             = tracing_layer::zeRTASParallelOperationDestroyExt;

    return result;
}